

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O2

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<int,long>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          long *out_value)

{
  DataBuffer *pDVar1;
  ulong uVar2;
  int *piVar3;
  int i;
  ulong uVar4;
  byte bVar5;
  
  pDVar1 = this->buffer_;
  piVar3 = (int *)((pDVar1->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                  this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
  uVar2 = 0;
  while( true ) {
    bVar5 = this->num_components_;
    uVar4 = (ulong)bVar5;
    if (out_num_components <= bVar5) {
      bVar5 = out_num_components;
    }
    if (bVar5 <= uVar2) goto LAB_00142c18;
    if ((pDVar1->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish <= piVar3) break;
    out_value[uVar2] = (long)*piVar3;
    piVar3 = piVar3 + 1;
    uVar2 = uVar2 + 1;
  }
LAB_00142c1d:
  return bVar5 <= uVar2;
LAB_00142c18:
  for (; uVar4 < out_num_components; uVar4 = uVar4 + 1) {
    out_value[uVar4] = 0;
  }
  goto LAB_00142c1d;
}

Assistant:

inline int64_t GetBytePos(AttributeValueIndex att_index) const {
    return byte_offset_ + byte_stride_ * att_index.value();
  }